

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

void INT_CMremove_periodic(CMTaskHandle handle)

{
  CMControlList p_Var1;
  
  p_Var1 = handle->cm->control_list;
  (*p_Var1->remove_periodic)(&CMstatic_trans_svcs,&p_Var1->select_data,handle->task);
  free(handle);
  return;
}

Assistant:

extern void
 INT_CMremove_periodic(CMTaskHandle handle)
 {
     CManager cm = handle->cm;
     cm->control_list->remove_periodic(&CMstatic_trans_svcs,
				       &cm->control_list->select_data, 
				       handle->task);
     free(handle);
 }